

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

weak_ordering compareThreeWay(QDateTime *lhs,QDateTime *rhs)

{
  long lVar1;
  bool bVar2;
  qint64 leftMillis;
  strong_ordering *this;
  QDateTime *in_RDI;
  long in_FS_OFFSET;
  qint64 rhms;
  qint64 lhms;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QDateTimeData *in_stack_ffffffffffffffc0;
  QDateTimeData *in_stack_ffffffffffffffc8;
  CompareUnderlyingType *pCVar3;
  CompareUnderlyingType local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QDateTime::isValid((QDateTime *)&in_stack_ffffffffffffffc0->data);
  if (bVar2) {
    bVar2 = QDateTime::isValid((QDateTime *)&in_stack_ffffffffffffffc0->data);
    if (bVar2) {
      getMSecs((QDateTimeData *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      leftMillis = getMSecs((QDateTimeData *)
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      bVar2 = usesSameOffset(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      if (!bVar2) {
        bVar2 = areFarEnoughApart(leftMillis,(qint64)in_stack_ffffffffffffffc8);
        if (!bVar2) {
          this = (strong_ordering *)QDateTime::toMSecsSinceEpoch(in_RDI);
          QDateTime::toMSecsSinceEpoch(in_RDI);
          Qt::compareThreeWay<long_long,_long_long,_true,_true>
                    ((longlong)this,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
          local_9 = (CompareUnderlyingType)Qt::strong_ordering::operator_cast_to_weak_ordering(this)
          ;
          goto LAB_00572548;
        }
      }
      Qt::compareThreeWay<long_long,_long_long,_true,_true>
                ((longlong)in_stack_ffffffffffffffc0,
                 CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      local_9 = (CompareUnderlyingType)
                Qt::strong_ordering::operator_cast_to_weak_ordering
                          ((strong_ordering *)&in_stack_ffffffffffffffc0->data);
    }
    else {
      local_9 = '\x01';
    }
  }
  else {
    bVar2 = QDateTime::isValid((QDateTime *)&in_stack_ffffffffffffffc0->data);
    if (bVar2) {
      pCVar3 = &Qt::weak_ordering::less;
    }
    else {
      pCVar3 = "";
    }
    local_9 = *pCVar3;
  }
LAB_00572548:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (weak_ordering)local_9;
  }
  __stack_chk_fail();
}

Assistant:

Qt::weak_ordering compareThreeWay(const QDateTime &lhs, const QDateTime &rhs)
{
    if (!lhs.isValid())
        return rhs.isValid() ? Qt::weak_ordering::less : Qt::weak_ordering::equivalent;

    if (!rhs.isValid())
        return Qt::weak_ordering::greater; // we know that lhs is valid here

    const qint64 lhms = getMSecs(lhs.d), rhms = getMSecs(rhs.d);
    if (usesSameOffset(lhs.d, rhs.d) || areFarEnoughApart(lhms, rhms))
        return Qt::compareThreeWay(lhms, rhms);

    // Convert to UTC and compare
    return Qt::compareThreeWay(lhs.toMSecsSinceEpoch(), rhs.toMSecsSinceEpoch());
}